

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

int parse_args_SINCOS(Context *ctx)

{
  int iVar1;
  int iVar2;
  
  if (ctx->major_ver < 3) {
    iVar1 = parse_args_DSSS(ctx);
    return iVar1;
  }
  iVar1 = parse_destination_token(ctx,&ctx->dest_arg);
  iVar2 = parse_source_token(ctx,ctx->source_args);
  return iVar2 + iVar1 + 1;
}

Assistant:

static int parse_args_SINCOS(Context *ctx)
{
    // this opcode needs extra registers for sm2 and lower.
    if (!shader_version_atleast(ctx, 3, 0))
        return parse_args_DSSS(ctx);
    return parse_args_DS(ctx);
}